

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cfgable.c
# Opt level: O0

void free_config_fields(OperationConfig *config)

{
  getout *pgVar1;
  getout *next;
  getout *urlnode;
  OperationConfig *config_local;
  
  free(config->random_file);
  config->random_file = (char *)0x0;
  free(config->egd_file);
  config->egd_file = (char *)0x0;
  free(config->useragent);
  config->useragent = (char *)0x0;
  free(config->altsvc);
  config->altsvc = (char *)0x0;
  free(config->hsts);
  config->hsts = (char *)0x0;
  curl_slist_free_all(config->cookies);
  free(config->cookiejar);
  config->cookiejar = (char *)0x0;
  curl_slist_free_all(config->cookiefiles);
  free(config->postfields);
  config->postfields = (char *)0x0;
  free(config->referer);
  config->referer = (char *)0x0;
  free(config->headerfile);
  config->headerfile = (char *)0x0;
  free(config->ftpport);
  config->ftpport = (char *)0x0;
  free(config->iface);
  config->iface = (char *)0x0;
  free(config->range);
  config->range = (char *)0x0;
  free(config->userpwd);
  config->userpwd = (char *)0x0;
  free(config->tls_username);
  config->tls_username = (char *)0x0;
  free(config->tls_password);
  config->tls_password = (char *)0x0;
  free(config->tls_authtype);
  config->tls_authtype = (char *)0x0;
  free(config->proxy_tls_username);
  config->proxy_tls_username = (char *)0x0;
  free(config->proxy_tls_password);
  config->proxy_tls_password = (char *)0x0;
  free(config->proxy_tls_authtype);
  config->proxy_tls_authtype = (char *)0x0;
  free(config->proxyuserpwd);
  config->proxyuserpwd = (char *)0x0;
  free(config->proxy);
  config->proxy = (char *)0x0;
  free(config->dns_ipv6_addr);
  config->dns_ipv6_addr = (char *)0x0;
  free(config->dns_ipv4_addr);
  config->dns_ipv4_addr = (char *)0x0;
  free(config->dns_interface);
  config->dns_interface = (char *)0x0;
  free(config->dns_servers);
  config->dns_servers = (char *)0x0;
  free(config->noproxy);
  config->noproxy = (char *)0x0;
  free(config->mail_from);
  config->mail_from = (char *)0x0;
  curl_slist_free_all(config->mail_rcpt);
  free(config->mail_auth);
  config->mail_auth = (char *)0x0;
  free(config->netrc_file);
  config->netrc_file = (char *)0x0;
  free(config->output_dir);
  config->output_dir = (char *)0x0;
  next = config->url_list;
  while (next != (getout *)0x0) {
    pgVar1 = next->next;
    free(next->url);
    next->url = (char *)0x0;
    free(next->outfile);
    next->outfile = (char *)0x0;
    free(next->infile);
    next->infile = (char *)0x0;
    free(next);
    next = pgVar1;
  }
  config->url_list = (getout *)0x0;
  config->url_last = (getout *)0x0;
  config->url_get = (getout *)0x0;
  config->url_out = (getout *)0x0;
  free(config->doh_url);
  config->doh_url = (char *)0x0;
  free(config->cipher_list);
  config->cipher_list = (char *)0x0;
  free(config->proxy_cipher_list);
  config->proxy_cipher_list = (char *)0x0;
  free(config->cert);
  config->cert = (char *)0x0;
  free(config->proxy_cert);
  config->proxy_cert = (char *)0x0;
  free(config->cert_type);
  config->cert_type = (char *)0x0;
  free(config->proxy_cert_type);
  config->proxy_cert_type = (char *)0x0;
  free(config->cacert);
  config->cacert = (char *)0x0;
  free(config->login_options);
  config->login_options = (char *)0x0;
  free(config->proxy_cacert);
  config->proxy_cacert = (char *)0x0;
  free(config->capath);
  config->capath = (char *)0x0;
  free(config->proxy_capath);
  config->proxy_capath = (char *)0x0;
  free(config->crlfile);
  config->crlfile = (char *)0x0;
  free(config->pinnedpubkey);
  config->pinnedpubkey = (char *)0x0;
  free(config->proxy_pinnedpubkey);
  config->proxy_pinnedpubkey = (char *)0x0;
  free(config->proxy_crlfile);
  config->proxy_crlfile = (char *)0x0;
  free(config->key);
  config->key = (char *)0x0;
  free(config->proxy_key);
  config->proxy_key = (char *)0x0;
  free(config->key_type);
  config->key_type = (char *)0x0;
  free(config->proxy_key_type);
  config->proxy_key_type = (char *)0x0;
  free(config->key_passwd);
  config->key_passwd = (char *)0x0;
  free(config->proxy_key_passwd);
  config->proxy_key_passwd = (char *)0x0;
  free(config->pubkey);
  config->pubkey = (char *)0x0;
  free(config->hostpubmd5);
  config->hostpubmd5 = (char *)0x0;
  free(config->engine);
  config->engine = (char *)0x0;
  free(config->etag_save_file);
  config->etag_save_file = (char *)0x0;
  free(config->etag_compare_file);
  config->etag_compare_file = (char *)0x0;
  free(config->request_target);
  config->request_target = (char *)0x0;
  free(config->customrequest);
  config->customrequest = (char *)0x0;
  free(config->krblevel);
  config->krblevel = (char *)0x0;
  free(config->oauth_bearer);
  config->oauth_bearer = (char *)0x0;
  free(config->sasl_authzid);
  config->sasl_authzid = (char *)0x0;
  free(config->unix_socket_path);
  config->unix_socket_path = (char *)0x0;
  free(config->writeout);
  config->writeout = (char *)0x0;
  free(config->proto_default);
  config->proto_default = (char *)0x0;
  curl_slist_free_all(config->quote);
  curl_slist_free_all(config->postquote);
  curl_slist_free_all(config->prequote);
  curl_slist_free_all(config->headers);
  curl_slist_free_all(config->proxyheaders);
  curl_mime_free(config->mimepost);
  config->mimepost = (curl_mime *)0x0;
  tool_mime_free(config->mimeroot);
  config->mimeroot = (tool_mime *)0x0;
  config->mimecurrent = (tool_mime *)0x0;
  curl_slist_free_all(config->telnet_options);
  curl_slist_free_all(config->resolve);
  curl_slist_free_all(config->connect_to);
  free(config->preproxy);
  config->preproxy = (char *)0x0;
  free(config->proxy_service_name);
  config->proxy_service_name = (char *)0x0;
  free(config->service_name);
  config->service_name = (char *)0x0;
  free(config->ftp_account);
  config->ftp_account = (char *)0x0;
  free(config->ftp_alternative_to_user);
  config->ftp_alternative_to_user = (char *)0x0;
  free(config->aws_sigv4);
  config->aws_sigv4 = (char *)0x0;
  return;
}

Assistant:

static void free_config_fields(struct OperationConfig *config)
{
  struct getout *urlnode;

  Curl_safefree(config->random_file);
  Curl_safefree(config->egd_file);
  Curl_safefree(config->useragent);
  Curl_safefree(config->altsvc);
  Curl_safefree(config->hsts);
  curl_slist_free_all(config->cookies);
  Curl_safefree(config->cookiejar);
  curl_slist_free_all(config->cookiefiles);

  Curl_safefree(config->postfields);
  Curl_safefree(config->referer);

  Curl_safefree(config->headerfile);
  Curl_safefree(config->ftpport);
  Curl_safefree(config->iface);

  Curl_safefree(config->range);

  Curl_safefree(config->userpwd);
  Curl_safefree(config->tls_username);
  Curl_safefree(config->tls_password);
  Curl_safefree(config->tls_authtype);
  Curl_safefree(config->proxy_tls_username);
  Curl_safefree(config->proxy_tls_password);
  Curl_safefree(config->proxy_tls_authtype);
  Curl_safefree(config->proxyuserpwd);
  Curl_safefree(config->proxy);

  Curl_safefree(config->dns_ipv6_addr);
  Curl_safefree(config->dns_ipv4_addr);
  Curl_safefree(config->dns_interface);
  Curl_safefree(config->dns_servers);

  Curl_safefree(config->noproxy);

  Curl_safefree(config->mail_from);
  curl_slist_free_all(config->mail_rcpt);
  Curl_safefree(config->mail_auth);

  Curl_safefree(config->netrc_file);
  Curl_safefree(config->output_dir);

  urlnode = config->url_list;
  while(urlnode) {
    struct getout *next = urlnode->next;
    Curl_safefree(urlnode->url);
    Curl_safefree(urlnode->outfile);
    Curl_safefree(urlnode->infile);
    Curl_safefree(urlnode);
    urlnode = next;
  }
  config->url_list = NULL;
  config->url_last = NULL;
  config->url_get = NULL;
  config->url_out = NULL;

  Curl_safefree(config->doh_url);
  Curl_safefree(config->cipher_list);
  Curl_safefree(config->proxy_cipher_list);
  Curl_safefree(config->cert);
  Curl_safefree(config->proxy_cert);
  Curl_safefree(config->cert_type);
  Curl_safefree(config->proxy_cert_type);
  Curl_safefree(config->cacert);
  Curl_safefree(config->login_options);
  Curl_safefree(config->proxy_cacert);
  Curl_safefree(config->capath);
  Curl_safefree(config->proxy_capath);
  Curl_safefree(config->crlfile);
  Curl_safefree(config->pinnedpubkey);
  Curl_safefree(config->proxy_pinnedpubkey);
  Curl_safefree(config->proxy_crlfile);
  Curl_safefree(config->key);
  Curl_safefree(config->proxy_key);
  Curl_safefree(config->key_type);
  Curl_safefree(config->proxy_key_type);
  Curl_safefree(config->key_passwd);
  Curl_safefree(config->proxy_key_passwd);
  Curl_safefree(config->pubkey);
  Curl_safefree(config->hostpubmd5);
  Curl_safefree(config->engine);
  Curl_safefree(config->etag_save_file);
  Curl_safefree(config->etag_compare_file);
  Curl_safefree(config->request_target);
  Curl_safefree(config->customrequest);
  Curl_safefree(config->krblevel);

  Curl_safefree(config->oauth_bearer);
  Curl_safefree(config->sasl_authzid);

  Curl_safefree(config->unix_socket_path);
  Curl_safefree(config->writeout);
  Curl_safefree(config->proto_default);

  curl_slist_free_all(config->quote);
  curl_slist_free_all(config->postquote);
  curl_slist_free_all(config->prequote);

  curl_slist_free_all(config->headers);
  curl_slist_free_all(config->proxyheaders);

  curl_mime_free(config->mimepost);
  config->mimepost = NULL;
  tool_mime_free(config->mimeroot);
  config->mimeroot = NULL;
  config->mimecurrent = NULL;

  curl_slist_free_all(config->telnet_options);
  curl_slist_free_all(config->resolve);
  curl_slist_free_all(config->connect_to);

  Curl_safefree(config->preproxy);
  Curl_safefree(config->proxy_service_name);
  Curl_safefree(config->service_name);

  Curl_safefree(config->ftp_account);
  Curl_safefree(config->ftp_alternative_to_user);

  Curl_safefree(config->aws_sigv4);
}